

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O3

UBool uhash_equals_63(UHashtable *hash1,UHashtable *hash2)

{
  int iVar1;
  void *pvVar2;
  UHashTok key;
  UHashElement *pUVar3;
  char cVar4;
  int32_t hashcode;
  UHashElement *pUVar5;
  int iVar6;
  long lVar7;
  
  if (hash1 == hash2) {
    return '\x01';
  }
  if ((hash2 != (UHashtable *)0x0 && hash1 != (UHashtable *)0x0) &&
     (hash1->keyComparator == hash2->keyComparator)) {
    if (hash1->valueComparator == (undefined1 *)0x0) {
      return '\0';
    }
    if (hash1->valueComparator != hash2->valueComparator) {
      return '\0';
    }
    iVar1 = hash1->count;
    if (iVar1 == hash2->count) {
      if (0 < iVar1) {
        lVar7 = -1;
        iVar6 = 0;
        do {
          lVar7 = (long)(int)lVar7;
          pUVar5 = hash1->elements + lVar7;
          do {
            pUVar3 = pUVar5;
            lVar7 = lVar7 + 1;
            pUVar5 = pUVar3 + 1;
          } while (pUVar3[1].hashcode < 0);
          pvVar2 = pUVar3[1].value.pointer;
          key = pUVar3[1].key;
          hashcode = (*hash2->keyHasher)(key);
          pUVar5 = _uhash_find(hash2,key,hashcode);
          cVar4 = (*(code *)hash1->valueComparator)(pvVar2,(pUVar5->value).pointer);
          if (cVar4 == '\0') {
            return '\0';
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 != iVar1);
      }
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_equals(const UHashtable* hash1, const UHashtable* hash2){
    int32_t count1, count2, pos, i;

    if(hash1==hash2){
        return TRUE;
    }

    /*
     * Make sure that we are comparing 2 valid hashes of the same type
     * with valid comparison functions.
     * Without valid comparison functions, a binary comparison
     * of the hash values will yield random results on machines
     * with 64-bit pointers and 32-bit integer hashes.
     * A valueComparator is normally optional.
     */
    if (hash1==NULL || hash2==NULL ||
        hash1->keyComparator != hash2->keyComparator ||
        hash1->valueComparator != hash2->valueComparator ||
        hash1->valueComparator == NULL)
    {
        /*
        Normally we would return an error here about incompatible hash tables,
        but we return FALSE instead.
        */
        return FALSE;
    }

    count1 = uhash_count(hash1);
    count2 = uhash_count(hash2);
    if(count1!=count2){
        return FALSE;
    }

    pos=UHASH_FIRST;
    for(i=0; i<count1; i++){
        const UHashElement* elem1 = uhash_nextElement(hash1, &pos);
        const UHashTok key1 = elem1->key;
        const UHashTok val1 = elem1->value;
        /* here the keys are not compared, instead the key form hash1 is used to fetch
         * value from hash2. If the hashes are equal then then both hashes should
         * contain equal values for the same key!
         */
        const UHashElement* elem2 = _uhash_find(hash2, key1, hash2->keyHasher(key1));
        const UHashTok val2 = elem2->value;
        if(hash1->valueComparator(val1, val2)==FALSE){
            return FALSE;
        }
    }
    return TRUE;
}